

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O3

bool __thiscall
sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::
has_connections(signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local> *this)

{
  size_t sVar1;
  
  (*(this->super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
    ).super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  sVar1 = (this->
          super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>)
          .m_connected_slots.
          super__List_base<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>_*>_>
          ._M_impl._M_node._M_size;
  (*(this->super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
    ).super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[3])(this);
  return sVar1 != 0;
}

Assistant:

bool has_connections(){
			lock_block<mt_policy> lock(this);
			if(this->m_connected_slots.size()==0){
				return false;
			}
			return true;
		}